

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.h
# Opt level: O1

string * __thiscall
cmGlobalWatcomWMakeGenerator::GetName_abi_cxx11_(cmGlobalWatcomWMakeGenerator *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x57206d6f63746157;
  *(undefined4 *)((long)&in_RDI->field_2 + 8) = 0x656b614d;
  in_RDI->_M_string_length = 0xc;
  (in_RDI->field_2)._M_local_buf[0xc] = '\0';
  return in_RDI;
}

Assistant:

std::string GetName() const CM_OVERRIDE
  {
    return cmGlobalWatcomWMakeGenerator::GetActualName();
  }